

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixCorotation.cpp
# Opt level: O3

void chrono::fea::ChMatrixCorotation::ComputeKCt
               (ChMatrixConstRef K,
               vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               *R,int nblocks,ChMatrixRef *KC)

{
  undefined1 auVar1 [16];
  long lVar2;
  pointer ppCVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  ulong local_48;
  
  uVar5 = 0;
  if (0 < nblocks) {
    lVar2 = (K->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value;
    ppCVar3 = (R->
              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar10 = 0;
    local_48 = 0;
    uVar9 = (uint)lVar2;
    do {
      if (0 < (int)uVar9) {
        lVar13 = 0;
        uVar11 = 0;
        pdVar4 = (double *)ppCVar3[local_48];
        do {
          lVar8 = 0;
          pdVar12 = pdVar4;
          do {
            if (lVar2 <= (long)uVar11) {
LAB_00619ae2:
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                            "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                           );
            }
            uVar6 = (K->
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    ).
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_cols.m_value;
            if ((long)uVar6 <= (long)uVar5) {
              uVar6 = uVar5;
            }
            if (uVar6 - uVar5 < 3) goto LAB_00619ae2;
            auVar14 = ZEXT864(0) << 0x40;
            lVar7 = 0;
            do {
              auVar15._8_8_ = 0;
              auVar15._0_8_ =
                   *(ulong *)((long)(K->
                                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                    ).
                                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                    .m_data +
                             lVar7 * 8 +
                             (K->
                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             ).m_stride.m_outer.m_value * lVar13 + lVar10);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = pdVar12[lVar7];
              auVar1 = vfmadd231sd_fma(auVar14._0_16_,auVar15,auVar1);
              auVar14 = ZEXT1664(auVar1);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            if (((KC->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value <= (long)uVar11) ||
               (lVar7 = lVar8 + local_48 * 3,
               (KC->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value <= lVar7)) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                           );
            }
            lVar8 = lVar8 + 1;
            pdVar12 = pdVar12 + 3;
            (KC->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data[lVar7 + (KC->
                            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                            ).m_stride.m_outer.m_value * uVar11] = auVar1._0_8_;
          } while (lVar8 != 3);
          uVar11 = uVar11 + 1;
          lVar13 = lVar13 + 8;
        } while (uVar11 != (~((int)uVar9 >> 0x1f) & uVar9));
      }
      uVar5 = (ulong)((int)uVar5 + 3);
      lVar10 = lVar10 + 0x18;
      local_48 = local_48 + 1;
    } while (local_48 != (uint)nblocks);
  }
  return;
}

Assistant:

void ChMatrixCorotation::ComputeKCt(ChMatrixConstRef K,                   // matrix to corotate
                                    const std::vector<ChMatrix33<>*>& R,  // 3x3 rotation matrices (used transposed)
                                    const int nblocks,                    // number of rotation blocks
                                    ChMatrixRef KC                        // result matrix: C*K
) {
    for (int iblock = 0; iblock < nblocks; iblock++) {
        const ChMatrix33<>* mR = R[iblock];

        double sum;
        for (int rowres = 0; rowres < (int)K.rows(); ++rowres)
            for (int row = 0; row < 3; ++row) {
                sum = 0;
                for (int col = 0; col < 3; ++col)
                    sum += K(rowres, col + (3 * iblock)) * (*mR)(row, col);
                KC(rowres, row + (3 * iblock)) = sum;
            }
    }
}